

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O0

bool Imf_3_4::areCounterparts(string *channel1,string *channel2,StringVector *multiView)

{
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  reference __rhs;
  string *in_RSI;
  string *in_RDI;
  size_t i;
  size_t size2;
  StringVector chan2;
  size_t size1;
  StringVector chan1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  reference in_stack_fffffffffffffee0;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 uVar4;
  undefined1 in_stack_fffffffffffffeef;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  size_type local_100;
  string local_f8 [32];
  string local_d8 [36];
  undefined4 local_b4;
  size_type local_b0;
  string local_a8 [8];
  StringVector *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  char in_stack_ffffffffffffff77;
  string *in_stack_ffffffffffffff78;
  string local_58 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  string *local_18;
  __type local_1;
  
  local_18 = in_RSI;
  std::__cxx11::string::string(local_58,in_RDI);
  anon_unknown_5::parseString(in_stack_ffffffffffffff78,in_stack_ffffffffffffff77);
  std::__cxx11::string::~string(local_58);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_38);
  std::__cxx11::string::string(local_a8,local_18);
  anon_unknown_5::parseString(in_stack_ffffffffffffff78,in_stack_ffffffffffffff77);
  std::__cxx11::string::~string(local_a8);
  local_b0 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&stack0xffffffffffffff78);
  if ((sVar3 == 0) || (local_b0 == 0)) {
    local_1 = false;
  }
  else {
    if (1 < sVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_38,sVar3 - 2);
      in_stack_fffffffffffffef4 =
           anon_unknown_5::viewNum
                     ((string *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
                      (StringVector *)in_stack_fffffffffffffed0);
      if (in_stack_fffffffffffffef4 == -1) {
        local_1 = false;
        goto LAB_00213b32;
      }
    }
    if (1 < local_b0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xffffffffffffff78,local_b0 - 2);
      in_stack_fffffffffffffef0 =
           anon_unknown_5::viewNum
                     ((string *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
                      (StringVector *)in_stack_fffffffffffffed0);
      if (in_stack_fffffffffffffef0 == -1) {
        local_1 = false;
        goto LAB_00213b32;
      }
    }
    viewFromChannelName(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    viewFromChannelName(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffeef,
                                     CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)))
    ;
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_d8);
    if ((bVar1 & 1) == 0) {
      if (sVar3 == 1) {
        uVar4 = false;
        local_1 = (__type)uVar4;
        if (local_b0 == 2) {
          in_stack_fffffffffffffee0 =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_38,0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&stack0xffffffffffffff78,1);
          local_1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                                    ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(bVar1,CONCAT16(uVar4,in_stack_fffffffffffffee8)));
        }
      }
      else if (local_b0 == 1) {
        local_1 = false;
        if (sVar3 == 2) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&stack0xffffffffffffff78,0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_38,1);
          local_1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                                    ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffeee,
                                                                in_stack_fffffffffffffee8)));
        }
      }
      else if (sVar3 == local_b0) {
        for (local_100 = 0; local_100 < sVar3; local_100 = local_100 + 1) {
          if (local_100 != sVar3 - 2) {
            __rhs = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&local_38,local_100);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&stack0xffffffffffffff78,local_100);
            bVar2 = std::operator!=(in_stack_fffffffffffffed0,__rhs);
            if (bVar2) {
              local_1 = false;
              goto LAB_00213b32;
            }
          }
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
LAB_00213b32:
  local_b4 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffee0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffee0);
  return (bool)(local_1 & 1);
}

Assistant:

bool
areCounterparts (
    const string&       channel1,
    const string&       channel2,
    const StringVector& multiView)
{
    //
    // Given two channels, return true if they are the same
    // channel in two different views.
    //

    StringVector chan1 = parseString (channel1);
    size_t       size1 = chan1.size (); // number of SECTIONS in string
                                        // name (not string length)

    StringVector chan2 = parseString (channel2);
    size_t       size2 = chan2.size ();

    if (size1 == 0 || size2 == 0) return false;

    //
    // channel1 and channel2 can't be counterparts
    // if either channel is in no view.
    //

    if (size1 > 1 && viewNum (chan1[size1 - 2], multiView) == -1) return false;

    if (size2 > 1 && viewNum (chan2[size2 - 2], multiView) == -1) return false;

    if (viewFromChannelName (channel1, multiView) ==
        viewFromChannelName (channel2, multiView))
    {
        //
        // channel1 and channel2 are not counterparts
        // if they are in the same view.
        //

        return false;
    }

    if (size1 == 1)
    {
        //
        // channel1 is a default channel - the channels will only be
        // counterparts if channel2 is of the form <view>.<channel1>
        //

        return size2 == 2 && chan1[0] == chan2[1];
    }

    if (size2 == 1)
    {
        //
        // channel2 is a default channel - the channels will only be
        // counterparts if channel1 is of the form <view>.<channel2>
        //

        return size1 == 2 && chan2[0] == chan1[1];
    }

    //
    // Neither channel is a default channel.  To be counterparts both
    // channel names must have the same number of components, and
    // all components except the penultimate one must be the same.
    //

    if (size1 != size2) return false;

    for (size_t i = 0; i < size1; ++i)
    {
        if (i != size1 - 2 && chan1[i] != chan2[i]) return false;
    }

    return true;
}